

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O2

bool absl::lts_20250127::str_format_internal::ConvertIntArg<absl::lts_20250127::uint128>
               (uint128 v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  bool bVar1;
  uint uVar2;
  IntDigits *as_digits_00;
  FormatSinkImpl *pFVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  string_view v_00;
  FormatConversionSpecImpl conv_00;
  FormatConversionSpecImpl conv_01;
  FormatConversionSpecImpl conv_02;
  IntDigits as_digits;
  IntDigits *local_68;
  uint local_60;
  IntDigits local_58;
  
  uVar2 = conv.precision_;
  as_digits_00 = conv._0_8_;
  conv_01.precision_ = (int)sink;
  pFVar3 = sink;
  local_68 = as_digits_00;
  local_60 = uVar2;
  switch((ulong)as_digits_00 & 0xff) {
  case 0:
    if ((conv._0_4_ & 0xff0000U) != 0x20000) {
      conv_00.precision_ = conv_01.precision_;
      conv_00._0_8_ = as_digits_00;
      anon_unknown_53::ConvertCharImpl
                ((char)v.lo_,conv_00,(FormatSinkImpl *)&switchD_003091d4::switchdataD_004512e8);
      return true;
    }
    conv_02.width_ = 0;
    conv_02.conv_ = (char)uVar2;
    conv_02.flags_ = (char)(uVar2 >> 8);
    conv_02.length_mod_ = (char)(uVar2 >> 0x10);
    conv_02._3_1_ = (char)(uVar2 >> 0x18);
    conv_02.precision_ = conv_01.precision_;
    bVar1 = anon_unknown_53::ConvertWCharTImpl
                      ((anon_unknown_53 *)(v.lo_ & 0xffffffff),conv._0_4_,conv_02,sink);
    return bVar1;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/str_format/arg.cc"
                  ,0x1c2,
                  "bool absl::str_format_internal::ConvertIntArg(T, FormatConversionSpecImpl, FormatSinkImpl *) [T = absl::uint128]"
                 );
  case 2:
  case 3:
  case 5:
  case 0x12:
    anon_unknown_53::IntDigits::PrintAsDec(&local_58,v,false);
    break;
  case 4:
    anon_unknown_53::IntDigits::PrintAsOct<absl::lts_20250127::uint128>(&local_58,v);
    break;
  case 6:
    anon_unknown_53::IntDigits::PrintAsHexLower<absl::lts_20250127::uint128>(&local_58,v);
    break;
  case 7:
    anon_unknown_53::IntDigits::PrintAsHexUpper<absl::lts_20250127::uint128>(&local_58,v);
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    auVar4._8_4_ = v.lo_._4_4_;
    auVar4._0_8_ = v.lo_;
    auVar4._12_4_ = 0x45300000;
    auVar5._8_4_ = v.hi_._4_4_;
    auVar5._0_8_ = v.hi_;
    auVar5._12_4_ = 0x45300000;
    bVar1 = ConvertFloatImpl(((auVar5._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)v.hi_) - 4503599627370496.0)) *
                             1.8446744073709552e+19 +
                             (auVar4._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)v.lo_) - 4503599627370496.0),
                             (FormatConversionSpecImpl *)&local_68,sink);
    return bVar1;
  }
  if (((undefined1  [12])conv & (undefined1  [12])0xff00) == (undefined1  [12])0x0) {
    v_00._M_str = local_58.start_;
    v_00._M_len = local_58.size_;
    FormatSinkImpl::Append(sink,v_00);
  }
  else {
    conv_01.width_ = 0;
    conv_01.conv_ = (char)uVar2;
    conv_01.flags_ = (char)(uVar2 >> 8);
    conv_01.length_mod_ = (char)(uVar2 >> 0x10);
    conv_01._3_1_ = (char)(uVar2 >> 0x18);
    anon_unknown_53::ConvertIntImplInnerSlow
              ((anon_unknown_53 *)&local_58,as_digits_00,conv_01,pFVar3);
  }
  return true;
}

Assistant:

bool ConvertIntArg(T v, FormatConversionSpecImpl conv, FormatSinkImpl *sink) {
  using U = typename MakeUnsigned<T>::type;
  IntDigits as_digits;

  // This odd casting is due to a bug in -Wswitch behavior in gcc49 which causes
  // it to complain about a switch/case type mismatch, even though both are
  // FormatConversionChar.  Likely this is because at this point
  // FormatConversionChar is declared, but not defined.
  switch (static_cast<uint8_t>(conv.conversion_char())) {
    case static_cast<uint8_t>(FormatConversionCharInternal::c):
      return (std::is_same<T, wchar_t>::value ||
              (conv.length_mod() == LengthMod::l))
                 ? ConvertWCharTImpl(static_cast<wchar_t>(v), conv, sink)
                 : ConvertCharImpl(static_cast<char>(v), conv, sink);

    case static_cast<uint8_t>(FormatConversionCharInternal::o):
      as_digits.PrintAsOct(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::x):
      as_digits.PrintAsHexLower(static_cast<U>(v));
      break;
    case static_cast<uint8_t>(FormatConversionCharInternal::X):
      as_digits.PrintAsHexUpper(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::u):
      as_digits.PrintAsDec(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::d):
    case static_cast<uint8_t>(FormatConversionCharInternal::i):
    case static_cast<uint8_t>(FormatConversionCharInternal::v):
      as_digits.PrintAsDec(v);
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::a):
    case static_cast<uint8_t>(FormatConversionCharInternal::e):
    case static_cast<uint8_t>(FormatConversionCharInternal::f):
    case static_cast<uint8_t>(FormatConversionCharInternal::g):
    case static_cast<uint8_t>(FormatConversionCharInternal::A):
    case static_cast<uint8_t>(FormatConversionCharInternal::E):
    case static_cast<uint8_t>(FormatConversionCharInternal::F):
    case static_cast<uint8_t>(FormatConversionCharInternal::G):
      return ConvertFloatImpl(static_cast<double>(v), conv, sink);

    default:
      ABSL_ASSUME(false);
  }

  if (conv.is_basic()) {
    sink->Append(as_digits.with_neg_and_zero());
    return true;
  }
  return ConvertIntImplInnerSlow(as_digits, conv, sink);
}